

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O3

bool __thiscall
cinemo::LameWrapper::encodeStereo_4_16(LameWrapper *this,string *in,string *out,lame_t *lame)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  ofstream mp3;
  ifstream wav;
  uchar mp3_buff [10240];
  short wav_buff_r [5120];
  short wav_buff_l [5120];
  long local_7c40;
  filebuf local_7c38 [240];
  ios_base local_7b48 [264];
  char local_7a40 [8];
  long local_7a38;
  undefined1 local_7838 [10240];
  undefined1 local_5038 [10240];
  undefined1 local_2838 [10248];
  
  std::ifstream::ifstream(local_7a40,(string *)in,_S_in|_S_bin);
  std::ofstream::ofstream(&local_7c40,(string *)out,_S_trunc|_S_out|_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      std::istream::ignore((long)local_7a40);
      do {
        std::istream::read(local_7a40,(long)local_2838);
        std::istream::read(local_7a40,(long)local_5038);
        lVar1 = local_7a38;
        if (local_7a38 == 0) {
          lame_encode_flush(*lame,local_7838,0x2800);
        }
        else {
          lame_encode_buffer(*lame,local_2838,local_5038,1,local_7838,0x2800);
        }
        std::ostream::write((char *)&local_7c40,(long)local_7838);
      } while (lVar1 != 0);
      std::ifstream::close();
      std::ofstream::close();
      bVar3 = true;
      goto LAB_00106013;
    }
  }
  std::__cxx11::string::append((char *)&this->message_buffer);
  bVar3 = false;
LAB_00106013:
  local_7c40 = _VTT;
  *(undefined8 *)(local_7c38 + *(long *)(_VTT + -0x18) + -8) = _lame_set_VBR;
  std::filebuf::~filebuf(local_7c38);
  std::ios_base::~ios_base(local_7b48);
  std::ifstream::~ifstream(local_7a40);
  return bVar3;
}

Assistant:

bool LameWrapper::encodeStereo_4_16(const string& in, const string& out,
                                        const lame_t& lame) {

        std::ifstream wav(in, std::ios_base::in | std::ios_base::binary);
        std::ofstream mp3(out, std::ios_base::out | std::ios_base::trunc |
                               std::ios_base::binary);

        //just to make sure...
        if (!wav.is_open() || !mp3.is_open()) {
			message_buffer.append("Error in reading / writing source and destination files.");
            return false;
        }

        std::streamsize read, write;

        //short int wav_buff[WAV_BUFF_SIZE]; //all channels
        short int wav_buff_l[WAV_BUFF_SIZE / 2]; //left channel
        short int wav_buff_r[WAV_BUFF_SIZE / 2]; //right channel
        unsigned char mp3_buff[MP3_BUFF_SIZE];

        wav.ignore(wh->DataBegin); //skip to data

        do {
            wav.read(reinterpret_cast<char*>(&wav_buff_l), sizeof(short int));
            wav.read(reinterpret_cast<char*>(&wav_buff_r), sizeof(short int));
            read = wav.gcount();

            if (read == 0) { //reading from wav file has ended!
				write = lame_encode_flush(lame,
							reinterpret_cast<unsigned char*>(&mp3_buff),
							MP3_BUFF_SIZE);
            } else { //encoding
                write = lame_encode_buffer(lame,
                            &wav_buff_l[0],
                            &wav_buff_r[0],
                            1,
                            mp3_buff,
                            MP3_BUFF_SIZE);

            }
            mp3.write(reinterpret_cast<char*>(&mp3_buff), write);
        } while (read != 0);

        wav.close();
        mp3.close();

        return true;
    }